

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void writeBPArmada(Manager *manager,int puzNum)

{
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  int local_230;
  int i;
  int local_21c;
  ostream local_218 [4];
  int vec;
  ofstream file;
  int puzNum_local;
  Manager *manager_local;
  
  std::ofstream::ofstream(local_218,"bpgArmada.txt",0x10);
  for (local_21c = 0; local_21c < puzNum; local_21c = local_21c + 1) {
    std::operator<<(local_218,"\nArmada Format\n");
    local_230 = 0;
    while( true ) {
      pvVar1 = std::vector<Board,_std::allocator<Board>_>::operator[]
                         (&manager->puzzles,(long)local_21c);
      sVar2 = std::vector<Ship,_std::allocator<Ship>_>::size(&pvVar1->armada);
      if (sVar2 <= (ulong)(long)local_230) break;
      pvVar1 = std::vector<Board,_std::allocator<Board>_>::operator[]
                         (&manager->puzzles,(long)local_21c);
      pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[](&pvVar1->armada,(long)local_230)
      ;
      poVar4 = std::operator<<(local_218,pvVar3->ID);
      poVar4 = std::operator<<(poVar4," ");
      pvVar1 = std::vector<Board,_std::allocator<Board>_>::operator[]
                         (&manager->puzzles,(long)local_21c);
      pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[](&pvVar1->armada,(long)local_230)
      ;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar3->sRow);
      poVar4 = std::operator<<(poVar4," ");
      pvVar1 = std::vector<Board,_std::allocator<Board>_>::operator[]
                         (&manager->puzzles,(long)local_21c);
      pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[](&pvVar1->armada,(long)local_230)
      ;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar3->sCol);
      poVar4 = std::operator<<(poVar4," ");
      pvVar1 = std::vector<Board,_std::allocator<Board>_>::operator[]
                         (&manager->puzzles,(long)local_21c);
      pvVar3 = std::vector<Ship,_std::allocator<Ship>_>::operator[](&pvVar1->armada,(long)local_230)
      ;
      poVar4 = std::operator<<(poVar4,pvVar3->orientation);
      std::operator<<(poVar4,"\n");
      local_230 = local_230 + 1;
    }
    std::operator<<(local_218,"\n\n\n");
  }
  std::ofstream::close();
  poVar4 = std::operator<<((ostream *)&std::cout,"File saved sucessfully! ;)");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void writeBPArmada( Manager manager, int puzNum )
{

    std::ofstream file("bpgArmada.txt");

    for( int vec = 0; vec < puzNum; vec++ )
    {
        file << "\nArmada Format\n";
        for( int i = 0; i < manager.puzzles[vec].armada.size(); i++ )
        {
            file << manager.puzzles[vec].armada[i].ID << " "
                 << manager.puzzles[vec].armada[i].sRow << " "
                 << manager.puzzles[vec].armada[i].sCol << " "
                 << manager.puzzles[vec].armada[i].orientation << "\n";
        }

         file << "\n\n\n";
    }

    file.close();

	std::cout << "File saved sucessfully! ;)" << std::endl;
}